

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O3

int graph_5_4::prim_2(m_graph g)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uStack_30;
  int iStack_28;
  undefined1 auStack_24 [4];
  
  iVar5 = g.vexs[8];
  uVar10 = (ulong)(uint)g.vexs[8];
  lVar3 = -(uVar10 * 4 + 0xf & 0xfffffffffffffff0);
  lVar4 = lVar3 + -0x28;
  if (1 < g.vexs[8]) {
    *(undefined8 *)((long)&uStack_30 + lVar3) = 0x103dbf;
    memcpy(auStack_24 + lVar3,&stack0x0000000c,(ulong)(g.vexs[8] - 1) << 2);
  }
  do {
    do {
    } while (iVar5 < 2);
    uVar8 = 0;
    iVar6 = -1;
    uVar7 = 1;
    do {
      iVar1 = *(int *)((long)&iStack_28 + uVar7 * 4 + lVar4 + 0x28);
      if (iVar1 != 0 && iVar1 < iVar6) {
        iVar6 = iVar1;
        uVar8 = uVar7 & 0xffffffff;
      }
      *(undefined4 *)((long)&iStack_28 + (long)(int)uVar8 * 4 + lVar4 + 0x28) = 0;
      uVar9 = 1;
      do {
        iVar1 = *(int *)((long)&iStack_28 + uVar9 * 4 + lVar4 + 0x28);
        if ((iVar1 != 0) && (iVar2 = g.arc[(long)(int)uVar8 + -1][uVar9 + 8], iVar2 < iVar1)) {
          *(int *)((long)&iStack_28 + uVar9 * 4 + lVar4 + 0x28) = iVar2;
        }
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar10);
  } while( true );
}

Assistant:

int prim_2(m_graph g) {
        int adjvex[g.vnum], dis[g.vnum], min, j, k;
        adjvex[0] = 0;
        dis[0] = 0;
        for (int i = 1; i < g.vnum; i++) {
            adjvex[i] = 0;
            dis[i] = g.arc[0][i];
        }
        for (int i = 1; i < g.vnum; i++) {
            min = INTMAX_MAX, j = 1, k = 0;
            while (j < g.vnum) {
                if (dis[j] != 0 && dis[j] < min) {
                    min = dis[j];
                    k = j;
                }
                j++;
                //do sth to adjvex[k]
                dis[k] = 0;
                for (int i = 1; i < g.vnum; i++) {
                    if (dis[i] != 0 && g.arc[k][i] < dis[i]) {
                        dis[i] = g.arc[k][i];
                        adjvex[i] = k;
                    }
                }
            }
        }
    }